

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitImplication
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,ImplicationExpr e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  bool bVar1;
  ExprBase e_00;
  ExprBase EVar2;
  LogicalConstant LVar3;
  SafeBool SVar4;
  ExprBase in_RDI;
  LogicalConstant c;
  LogicalExpr else_expr;
  ExprBase in_stack_ffffffffffffff78;
  BasicStringRef<char> *in_stack_ffffffffffffff80;
  type_conflict tVar5;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *this_00;
  BasicWriter<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  ExprBase in_stack_ffffffffffffffc0;
  int iVar6;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_ffffffffffffffc8;
  ExprBase this_01;
  ExprBase in_stack_ffffffffffffffd0;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffffc0.impl_ >> 0x20);
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::condition
            ((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
              *)in_stack_ffffffffffffff78.impl_);
  Visit(in_stack_ffffffffffffffc8,(LogicalExpr)in_stack_ffffffffffffffd0.impl_,iVar6);
  this_00 = *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> **)(in_RDI.impl_ + 2);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78.impl_);
  tVar5 = (type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  value.size_ = in_stack_ffffffffffffffb0;
  value.data_ = in_stack_ffffffffffffffa8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,value);
  e_00.impl_ = (Impl *)BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                       ::then_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                                    *)in_stack_ffffffffffffff78.impl_);
  Visit(in_stack_ffffffffffffffc8,(LogicalExpr)e_00.impl_,iVar6);
  EVar2.impl_ = (Impl *)BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                        ::else_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                                     *)in_stack_ffffffffffffff78.impl_);
  this_01.impl_ = EVar2.impl_;
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (this_00,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)in_RDI.impl_,tVar5);
  LVar3 = internal::ExprTypes::Cast<mp::LogicalConstant>((Expr)in_stack_ffffffffffffff78.impl_);
  iVar6 = LVar3.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_;
  SVar4 = internal::ExprBase::operator_cast_to_function_pointer
                    ((ExprBase *)&stack0xffffffffffffffc0);
  if ((SVar4 != 0) && (bVar1 = LogicalConstant::value((LogicalConstant *)0x1c8d53), !bVar1)) {
    return;
  }
  fmt::BasicStringRef<char>::BasicStringRef
            (*(BasicStringRef<char> **)(in_RDI.impl_ + 2),(char *)in_stack_ffffffffffffff78.impl_);
  value_00.size_ = (size_t)EVar2.impl_;
  value_00.data_ = in_stack_ffffffffffffffa8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,value_00);
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this_01.impl_,
        (LogicalExpr)e_00.impl_,iVar6);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitImplication(ImplicationExpr e) {
  Visit(e.condition());
  writer_ << " ==> ";
  Visit(e.then_expr(), prec::IMPLICATION + 1);
  LogicalExpr else_expr = e.else_expr();
  LogicalConstant c = ExprTypes::template Cast<LogicalConstant>(else_expr);
  if (!c || c.value() != 0) {
    writer_ << " else ";
    Visit(else_expr);
  }
}